

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildWithDepsLogTestDepsIgnoredInDryRun::Run(BuildWithDepsLogTestDepsIgnoredInDryRun *this)

{
  Test *pTVar1;
  char *input;
  bool bVar2;
  int iVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  VirtualFileSystem *this_00;
  allocator<char> local_301;
  string local_300;
  undefined1 local_2e0 [8];
  string err;
  Builder builder;
  int fail_count_1;
  undefined1 local_1d0 [4];
  int fail_count;
  State state;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *manifest;
  BuildWithDepsLogTestDepsIgnoredInDryRun *this_local;
  
  local_18 = "build out: cat in1\n  deps = gcc\n  depfile = in1.d\n";
  manifest = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"out",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  VirtualFileSystem::Create
            (&(this->super_BuildWithDepsLogTest).super_BuildTest.fs_,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Tick(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"in1",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"",
             (allocator<char> *)
             ((long)&state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  VirtualFileSystem::Create(this_00,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  State::State((State *)local_1d0);
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,(State *)local_1d0);
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar3 == iVar4) {
    iVar3 = testing::Test::AssertionFailures(g_current_test);
    input = local_18;
    ManifestParserOptions::ManifestParserOptions
              ((ManifestParserOptions *)((long)&builder.scan_.dyndep_loader_.disk_interface_ + 4));
    AssertParse((State *)local_1d0,input,stack0xfffffffffffffe1c);
    iVar4 = testing::Test::AssertionFailures(g_current_test);
    if (iVar3 == iVar4) {
      (this->super_BuildWithDepsLogTest).super_BuildTest.config_.dry_run = true;
      Builder::Builder((Builder *)((long)&err.field_2 + 8),(State *)local_1d0,
                       &(this->super_BuildWithDepsLogTest).super_BuildTest.config_,(BuildLog *)0x0,
                       (DepsLog *)0x0,
                       &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.super_DiskInterface);
      std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                 &builder.plan_.command_edges_,
                 &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                  super_CommandRunner);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.commands_ran_);
      std::__cxx11::string::string((string *)local_2e0);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"out",&local_301);
      pNVar5 = Builder::AddTarget((Builder *)((long)&err.field_2 + 8),&local_300,(string *)local_2e0
                                 );
      testing::Test::Check
                (pTVar1,pNVar5 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x8d9,"builder.AddTarget(\"out\", &err)");
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator(&local_301);
      pTVar1 = g_current_test;
      bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2e0);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x8da,"\"\" == err");
      pTVar1 = g_current_test;
      if (bVar2) {
        bVar2 = Builder::Build((Builder *)((long)&err.field_2 + 8),(string *)local_2e0);
        testing::Test::Check
                  (pTVar1,bVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x8db,"builder.Build(&err)");
        pTVar1 = g_current_test;
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                        commands_ran_);
        bVar2 = testing::Test::Check
                          (pTVar1,sVar6 == 1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x8dc,"1u == command_runner_.commands_ran_.size()");
        if (bVar2) {
          std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::release
                    ((unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> *)
                     &builder.plan_.command_edges_);
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
      std::__cxx11::string::~string((string *)local_2e0);
      Builder::~Builder((Builder *)((long)&err.field_2 + 8));
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  State::~State((State *)local_1d0);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, DepsIgnoredInDryRun) {
  const char* manifest =
      "build out: cat in1\n"
      "  deps = gcc\n"
      "  depfile = in1.d\n";

  fs_.Create("out", "");
  fs_.Tick();
  fs_.Create("in1", "");

  State state;
  ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

  // The deps log is NULL in dry runs.
  config_.dry_run = true;
  Builder builder(&state, config_, NULL, NULL, &fs_);
  builder.command_runner_.reset(&command_runner_);
  command_runner_.commands_ran_.clear();

  string err;
  EXPECT_TRUE(builder.AddTarget("out", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder.Build(&err));
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());

  builder.command_runner_.release();
}